

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDdPMR::processFS2(DSDdPMR *this,int symbolIndex,int dibit)

{
  bool bVar1;
  double __x;
  SyncPattern patterns [2];
  DSDSync syncEngine;
  SyncPattern local_88 [3];
  DSDSync local_7c;
  
  this->m_syncDoubleBuffer[symbolIndex] = (1U < (uint)dibit) * '\x02' + '\x01';
  if (symbolIndex == 0xb) {
    local_88[0] = SyncDPMRFS2;
    local_88[1] = SyncDPMRFS3;
    DSDSync::matchSome(&local_7c,this->m_syncDoubleBuffer,0xc,local_88,2);
    bVar1 = DSDSync::isMatching(&local_7c,SyncDPMRFS2);
    if (bVar1) {
      this->m_frameType = DPMRPayloadFrame;
    }
    else {
      bVar1 = DSDSync::isMatching(&local_7c,SyncDPMRFS3);
      if (bVar1) {
        this->m_state = DPMREnd;
        this->m_symbolIndex = 0;
      }
      else {
        DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,__x);
        this->m_state = DPMRExtSearch;
        this->m_frameType = DPMRExtSearchFrame;
        this->m_syncCycle = 0;
        this->m_symbolIndex = 0;
      }
    }
  }
  return;
}

Assistant:

void DSDdPMR::processFS2(int symbolIndex, int dibit)
{
    if ((dibit == 0) || (dibit == 1)) // positives (+1 or +3) => store 1 which maps to +3
    {
        m_syncDoubleBuffer[symbolIndex] = 1;
    }
    else
    {
        m_syncDoubleBuffer[symbolIndex] = 3;
    }

    if (symbolIndex == 11) // last symbol
    {
        DSDSync syncEngine;
        const DSDSync::SyncPattern patterns[2] = { DSDSync::SyncDPMRFS2, DSDSync::SyncDPMRFS3 };
        syncEngine.matchSome(m_syncDoubleBuffer, 12, patterns, 2);

        if (syncEngine.isMatching(DSDSync::SyncDPMRFS2)) // start of superframes
        {
            // nothing
            m_frameType = DPMRPayloadFrame;
        }
        else if (syncEngine.isMatching(DSDSync::SyncDPMRFS3)) // end frame
        {
            m_state = DPMREnd;
            m_symbolIndex = 0;
        }
        else
        {
            m_dsdDecoder->getLogger().log("DSDdPMR::processFS2: start extensive sync search\n"); // DEBUG
            m_frameType = DPMRExtSearchFrame;
            m_state = DPMRExtSearch;
            m_symbolIndex = 0;
            m_syncCycle = 0;
        }
    }
}